

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function.cpp
# Opt level: O3

string * __thiscall
duckdb::TableFunctionRef::ToString_abi_cxx11_(string *__return_storage_ptr__,TableFunctionRef *this)

{
  pointer pPVar1;
  string local_38;
  
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->function);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_38,pPVar1);
  TableRef::BaseToString
            (__return_storage_ptr__,&this->super_TableRef,&local_38,
             &(this->super_TableRef).column_name_alias);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string TableFunctionRef::ToString() const {
	return BaseToString(function->ToString(), column_name_alias);
}